

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_GetGlyphBox(stbtt_fontinfo *info,int glyph_index,int *x0,int *y0,int *x1,int *y1)

{
  stbtt_int16 sVar1;
  int iVar2;
  stbtt_fontinfo *in_RCX;
  int *in_RDX;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int g;
  undefined4 in_stack_00000030;
  
  if (*(int *)(in_RDI + 0x4c) == 0) {
    iVar2 = stbtt__GetGlyfOffset(in_RCX,(int)((ulong)in_R8 >> 0x20));
    if (iVar2 < 0) {
      return 0;
    }
    if (in_RDX != (int *)0x0) {
      sVar1 = ttSHORT((stbtt_uint8 *)(*(long *)(in_RDI + 8) + (long)iVar2 + 2));
      *in_RDX = (int)sVar1;
    }
    if (in_RCX != (stbtt_fontinfo *)0x0) {
      sVar1 = ttSHORT((stbtt_uint8 *)(*(long *)(in_RDI + 8) + (long)iVar2 + 4));
      *(int *)&in_RCX->userdata = (int)sVar1;
    }
    if (in_R8 != (int *)0x0) {
      sVar1 = ttSHORT((stbtt_uint8 *)(*(long *)(in_RDI + 8) + (long)iVar2 + 6));
      *in_R8 = (int)sVar1;
    }
    if (in_R9 != (int *)0x0) {
      sVar1 = ttSHORT((stbtt_uint8 *)(*(long *)(in_RDI + 8) + (long)iVar2 + 8));
      *in_R9 = (int)sVar1;
    }
  }
  else {
    stbtt__GetGlyphInfoT2
              ((stbtt_fontinfo *)CONCAT44(glyph_index,in_stack_00000030),x0._4_4_,y0,x1,y1,
               in_stack_00000008);
  }
  return 1;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphBox(const stbtt_fontinfo *info, int glyph_index, int *x0, int *y0, int *x1, int *y1)
{
   if (info->cff.size) {
      stbtt__GetGlyphInfoT2(info, glyph_index, x0, y0, x1, y1);
   } else {
      int g = stbtt__GetGlyfOffset(info, glyph_index);
      if (g < 0) return 0;

      if (x0) *x0 = ttSHORT(info->data + g + 2);
      if (y0) *y0 = ttSHORT(info->data + g + 4);
      if (x1) *x1 = ttSHORT(info->data + g + 6);
      if (y1) *y1 = ttSHORT(info->data + g + 8);
   }
   return 1;
}